

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_key_derivation_abort(psa_key_derivation_operation_t *operation)

{
  psa_algorithm_t pVar1;
  psa_status_t local_14;
  psa_algorithm_t kdf_alg;
  psa_status_t status;
  psa_key_derivation_operation_t *operation_local;
  
  local_14 = 0;
  pVar1 = psa_key_derivation_get_kdf_alg(operation);
  if (pVar1 != 0) {
    if ((pVar1 & 0xffffff00) == 0x20000100) {
      free((operation->ctx).hkdf.info);
      local_14 = psa_hmac_abort_internal(&(operation->ctx).hkdf.hmac);
    }
    else if (((pVar1 & 0xffffff00) == 0x20000200) || ((pVar1 & 0xffffff00) == 0x20000300)) {
      if ((operation->ctx).hkdf.info_length != 0) {
        mbedtls_platform_zeroize
                  ((operation->ctx).tls12_prf.seed,(operation->ctx).tls12_prf.seed_length);
        free((operation->ctx).tls12_prf.seed);
      }
      if ((operation->ctx).tls12_prf.label != (uint8_t *)0x0) {
        mbedtls_platform_zeroize
                  ((operation->ctx).tls12_prf.label,(operation->ctx).tls12_prf.label_length);
        free((operation->ctx).tls12_prf.label);
      }
      local_14 = psa_hmac_abort_internal
                           ((psa_hmac_internal_data *)
                            ((long)&(operation->ctx).hkdf.hmac.hash_ctx.ctx + 0x10));
    }
    else {
      local_14 = -0x89;
    }
  }
  mbedtls_platform_zeroize(operation,0x218);
  return local_14;
}

Assistant:

psa_status_t psa_key_derivation_abort( psa_key_derivation_operation_t *operation )
{
    psa_status_t status = PSA_SUCCESS;
    psa_algorithm_t kdf_alg = psa_key_derivation_get_kdf_alg( operation );
    if( kdf_alg == 0 )
    {
        /* The object has (apparently) been initialized but it is not
         * in use. It's ok to call abort on such an object, and there's
         * nothing to do. */
    }
    else
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) )
    {
        mbedtls_free( operation->ctx.hkdf.info );
        status = psa_hmac_abort_internal( &operation->ctx.hkdf.hmac );
    }
    else if( PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
             /* TLS-1.2 PSK-to-MS KDF uses the same core as TLS-1.2 PRF */
             PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        if( operation->ctx.tls12_prf.seed != NULL )
        {
            mbedtls_platform_zeroize( operation->ctx.tls12_prf.seed,
                                      operation->ctx.tls12_prf.seed_length );
            mbedtls_free( operation->ctx.tls12_prf.seed );
        }

        if( operation->ctx.tls12_prf.label != NULL )
        {
            mbedtls_platform_zeroize( operation->ctx.tls12_prf.label,
                                      operation->ctx.tls12_prf.label_length );
            mbedtls_free( operation->ctx.tls12_prf.label );
        }

        status = psa_hmac_abort_internal( &operation->ctx.tls12_prf.hmac );

        /* We leave the fields Ai and output_block to be erased safely by the
         * mbedtls_platform_zeroize() in the end of this function. */
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        status = PSA_ERROR_BAD_STATE;
    }
    mbedtls_platform_zeroize( operation, sizeof( *operation ) );
    return( status );
}